

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::GL>::execute_positive_test
          (TestCaseBase<glcts::ArraysOfArrays::Interface::GL> *this,string *vertex_shader_source,
          string *fragment_shader_source,bool delete_generated_objects,bool require_gpu_shader5)

{
  int iVar1;
  GLint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  undefined7 in_register_00000081;
  GLint link_status;
  long lVar4;
  
  iVar1 = (*this->context_id->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  link_status = 1;
  iVar1 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                    (this,fragment_shader_source,0,
                     CONCAT71(in_register_00000081,require_gpu_shader5) & 0xffffffff);
  if (iVar1 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "The fragment shader was expected to compile successfully, but failed to compile.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x394);
  }
  else {
    iVar1 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                      (this,vertex_shader_source,1,require_gpu_shader5);
    if (iVar1 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The vertex shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x39f);
    }
    else {
      if (this->program_object_id != 0) {
        __assert_fail("0 == program_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x3a7,
                      "virtual tcu::TestNode::IterateResult glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::GL>::execute_positive_test(const std::string &, const std::string &, bool, bool) [API = glcts::ArraysOfArrays::Interface::GL]"
                     );
      }
      GVar2 = (**(code **)(lVar4 + 0x3c8))();
      this->program_object_id = GVar2;
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not create a program object.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x3a9);
      (**(code **)(lVar4 + 0x10))(this->program_object_id,this->fragment_shader_object_id);
      (**(code **)(lVar4 + 0x10))(this->program_object_id,this->vertex_shader_object_id);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glAttachShader() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x3ae);
      (**(code **)(lVar4 + 0x470))(this->fragment_shader_object_id);
      (**(code **)(lVar4 + 0x470))(this->vertex_shader_object_id);
      this->fragment_shader_object_id = 0;
      this->vertex_shader_object_id = 0;
      (**(code **)(lVar4 + 0xce8))(this->program_object_id);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glLinkProgram() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x3b7);
      (**(code **)(lVar4 + 0x9d8))(this->program_object_id,0x8b82,&link_status);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x3bb);
      if (link_status == 1) {
        if (delete_generated_objects) {
          (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        return CONTINUE;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Linking was expected to succeed, but the process was unsuccessful.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x3d7);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TestCaseBase<API>::execute_positive_test(const std::string& vertex_shader_source,
																	  const std::string& fragment_shader_source,
																	  bool				 delete_generated_objects,
																	  bool				 require_gpu_shader5)
{
	glw::GLint			  compile_status = GL_TRUE;
	const glw::Functions& gl			 = context_id.getRenderContext().getFunctions();
	glw::GLint			  link_status	= GL_TRUE;
	bool				  test_result	= true;

	/* Compile, and check the compilation result for the fragment shader object. */
	compile_status = compile_shader_and_get_compilation_result(
		fragment_shader_source, TestCaseBase<API>::FRAGMENT_SHADER_TYPE, require_gpu_shader5);

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("The fragment shader was expected to compile successfully, but failed to compile.");

		test_result = false;
	}

	/* Compile, and check the compilation result for the vertex shader object. */
	compile_status = compile_shader_and_get_compilation_result(
		vertex_shader_source, TestCaseBase<API>::VERTEX_SHADER_TYPE, require_gpu_shader5);

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("The vertex shader was expected to compile successfully, but failed to compile.");

		test_result = false;
	}

	if (true == test_result)
	{
		/* Create program object. */
		assert(0 == program_object_id);
		program_object_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a program object.");

		/* Configure the program object */
		gl.attachShader(program_object_id, fragment_shader_object_id);
		gl.attachShader(program_object_id, vertex_shader_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed.");

		gl.deleteShader(fragment_shader_object_id);
		gl.deleteShader(vertex_shader_object_id);
		fragment_shader_object_id = 0;
		vertex_shader_object_id   = 0;

		/* Link the program object */
		gl.linkProgram(program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed.");

		/* Make sure the linking operation succeeded. */
		gl.getProgramiv(program_object_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed.");

		if (link_status != GL_TRUE)
		{
#if IS_DEBUG
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(program_object_id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(program_object_id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context_id.getTestContext().getLog() << tcu::TestLog::Message << "Error message: " << &message[0]
												 << tcu::TestLog::EndMessage;

#if IS_DEBUG_DUMP_ALL_SHADERS
#else  /* IS_DEBUG_DUMP_ALL_SHADERS */
			context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(vertex_shader_source);
			context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(fragment_shader_source);
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */
#endif /* IS_DEBUG */

			TCU_FAIL("Linking was expected to succeed, but the process was unsuccessful.");

			test_result = false;
		}
	}

	if (delete_generated_objects)
	{
		/* Deallocate any resources used. */
		this->delete_objects();
	}

	/* Return test pass if true. */
	if (true == test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return CONTINUE;
}